

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

void ipc_on_connection_tcp_conn(uv_stream_t *server,int status)

{
  int iVar1;
  uv_tcp_t *tcp;
  undefined8 uVar2;
  char *pcVar3;
  uv_buf_t local_18;
  
  if (status == 0) {
    if (server == (uv_stream_t *)&tcp_server) {
      tcp = (uv_tcp_t *)malloc(0xf8);
      if (tcp == (uv_tcp_t *)0x0) {
        pcVar3 = "conn";
        uVar2 = 700;
      }
      else {
        iVar1 = uv_tcp_init(tcp_server.loop,tcp);
        if (iVar1 == 0) {
          iVar1 = uv_accept((uv_stream_t *)&tcp_server,(uv_stream_t *)tcp);
          if (iVar1 == 0) {
            local_18 = uv_buf_init("hello\n",6);
            iVar1 = uv_write2(&conn_notify_req,(uv_stream_t *)&channel,&local_18,1,
                              (uv_stream_t *)tcp,(uv_write_cb)0x0);
            if (iVar1 == 0) {
              iVar1 = uv_read_start((uv_stream_t *)tcp,on_read_alloc,on_tcp_child_process_read);
              if (iVar1 == 0) {
                uv_close((uv_handle_t *)tcp,close_cb);
                return;
              }
              pcVar3 = "r == 0";
              uVar2 = 0x2cd;
            }
            else {
              pcVar3 = "r == 0";
              uVar2 = 0x2c8;
            }
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0x2c2;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0x2bf;
        }
      }
    }
    else {
      pcVar3 = "(uv_stream_t*)&tcp_server == server";
      uVar2 = 0x2b9;
    }
  }
  else {
    pcVar3 = "status == 0";
    uVar2 = 0x2b8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void ipc_on_connection_tcp_conn(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;
  uv_tcp_t* conn;

  ASSERT(status == 0);
  ASSERT((uv_stream_t*)&tcp_server == server);

  conn = malloc(sizeof(*conn));
  ASSERT(conn);

  r = uv_tcp_init(server->loop, conn);
  ASSERT(r == 0);

  r = uv_accept(server, (uv_stream_t*)conn);
  ASSERT(r == 0);

  /* Send the accepted connection to the other process */
  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
    (uv_stream_t*)conn, NULL);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) conn,
                    on_read_alloc,
                    on_tcp_child_process_read);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)conn, close_cb);
}